

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composite_decorator.cpp
# Opt level: O0

Element __thiscall ftxui::vcenter(ftxui *this,Element *child)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Element EVar1;
  Decorator local_88;
  shared_ptr<ftxui::Node> local_58;
  shared_ptr<ftxui::Node> local_48;
  shared_ptr<ftxui::Node> local_38;
  Element local_28;
  Element *local_18;
  Element *child_local;
  
  local_18 = child;
  child_local = (Element *)this;
  filler();
  std::shared_ptr<ftxui::Node>::shared_ptr(&local_48,child);
  filler();
  vbox<std::shared_ptr<ftxui::Node>,std::shared_ptr<ftxui::Node>,std::shared_ptr<ftxui::Node>>
            ((ftxui *)&local_28,&local_38,&local_48,&local_58);
  std::function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)>::
  function<std::shared_ptr<ftxui::Node>(&)(std::shared_ptr<ftxui::Node>),void>
            ((function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)> *)&local_88,
             yflex_grow);
  operator|(this,&local_28,&local_88);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function(&local_88);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_28);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_58);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_48);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_38);
  EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element vcenter(Element child) {
  return vbox(filler(), std::move(child), filler()) | yflex_grow;
}